

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O0

bool __thiscall
Centaurus::ATNMachine<char>::verify_invocations
          (ATNMachine<char> *this,
          unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
          *network)

{
  bool bVar1;
  ATNNodeType AVar2;
  Identifier *__x;
  _Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_true>
  local_48;
  ATNNode<char> *local_40;
  ATNNode<char> *node;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_> *__range2;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
  *network_local;
  ATNMachine<char> *this_local;
  
  __end0 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::begin
                     (&this->m_nodes);
  node = (ATNNode<char> *)
         std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::end
                   (&this->m_nodes);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::ATNNode<char>_*,_std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>_>
                                *)&node);
    if (!bVar1) {
      return true;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_Centaurus::ATNNode<char>_*,_std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>_>
               ::operator*(&__end0);
    AVar2 = ATNNode<char>::type(local_40);
    if (AVar2 == Nonterminal) {
      __x = ATNNode<char>::get_invoke(local_40);
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
           ::find(network,__x);
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
           ::cend(network);
      bVar1 = std::__detail::operator==(&local_48,&local_50);
      if (bVar1) {
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Centaurus::ATNNode<char>_*,_std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

bool ATNMachine<TCHAR>::verify_invocations(const std::unordered_map<Identifier, ATNMachine<TCHAR> >& network) const
{
	for (const auto& node : m_nodes)
	{
		if (node.type() == ATNNodeType::Nonterminal)
		{
			if (network.find(node.get_invoke()) == network.cend())
			{
				return false;
			}
		}
	}

	return true;
}